

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemWatcher_inotify.cpp
# Opt level: O3

int __thiscall FileSystemWatcher::init(FileSystemWatcher *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  undefined7 extraout_var;
  code *pcVar3;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  EventLoop *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  iVar2 = inotify_init1(0x80000);
  this->mFd = iVar2;
  if (iVar2 != -1) {
    EventLoop::eventLoop();
    iVar2 = this->mFd;
    local_48._8_8_ = 0;
    local_48._M_unused._M_object = operator_new(0x18);
    *(code **)local_48._M_unused._0_8_ = notifyReadyRead;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
    *(FileSystemWatcher **)((long)local_48._M_unused._0_8_ + 0x10) = this;
    local_30 = std::
               _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(FileSystemWatcher::*(FileSystemWatcher_*))()>_>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(FileSystemWatcher::*(FileSystemWatcher_*))()>_>
               ::_M_manager;
    EventLoop::registerSocket(local_28,iVar2,1,(function<void_(int,_unsigned_int)> *)&local_48);
    pcVar3 = local_38;
    if (local_38 != (code *)0x0) {
      bVar1 = (*local_38)(&local_48,&local_48,__destroy_functor);
      pcVar3 = (code *)CONCAT71(extraout_var,bVar1);
    }
    iVar2 = (int)pcVar3;
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
      iVar2 = extraout_EAX;
    }
    return iVar2;
  }
  __assert_fail("mFd != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/FileSystemWatcher_inotify.cpp"
                ,0x11,"void FileSystemWatcher::init()");
}

Assistant:

void FileSystemWatcher::init()
{
    mFd = inotify_init1(IN_CLOEXEC);
    assert(mFd != -1);
    EventLoop::eventLoop()->registerSocket(mFd, EventLoop::SocketRead, std::bind(&FileSystemWatcher::notifyReadyRead, this));
}